

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MauProxy.cpp
# Opt level: O0

void __thiscall mau::PacketQueue::InsertSorted(PacketQueue *this,QueueNode *node)

{
  QueueNode *prev;
  QueueNode *next;
  uint64_t deliveryUsec;
  QueueNode *node_local;
  PacketQueue *this_local;
  
  next = (QueueNode *)0x0;
  prev = this->Tail;
  while( true ) {
    if (prev == (QueueNode *)0x0) {
      this->Head = node;
      if (next == (QueueNode *)0x0) {
        this->Tail = node;
      }
      else {
        next->Prev = node;
      }
      node->Next = next;
      node->Prev = (QueueNode *)0x0;
      return;
    }
    if (prev->DeliveryUsec <= node->DeliveryUsec) break;
    next = prev;
    prev = prev->Prev;
  }
  if (prev == (QueueNode *)0x0) {
    this->Head = node;
  }
  else {
    prev->Next = node;
  }
  if (next == (QueueNode *)0x0) {
    this->Tail = node;
  }
  else {
    next->Prev = node;
  }
  node->Next = next;
  node->Prev = prev;
  return;
}

Assistant:

void PacketQueue::InsertSorted(QueueNode* node)
{
    const uint64_t deliveryUsec = node->DeliveryUsec;

    QueueNode* next = nullptr;

    // Insert at front or middle (based on target delivery time):
    for (QueueNode* prev = Tail; prev; next = prev, prev = prev->Prev)
    {
        // If we should insert after prev:
        if (deliveryUsec >= prev->DeliveryUsec)
        {
            if (prev) {
                prev->Next = node;
            }
            else {
                Head = node;
            }
            if (next) {
                next->Prev = node;
            }
            else {
                Tail = node;
            }
            node->Next = next;
            node->Prev = prev;

            return;
        }
    }

    // Insert at the front:
    Head = node;
    if (next) {
        next->Prev = node;
    }
    else {
        Tail = node;
    }
    node->Next = next;
    node->Prev = nullptr;
}